

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

bool __thiscall
cmGlobalGhsMultiGenerator::SetGeneratorToolset
          (cmGlobalGhsMultiGenerator *this,string *ts,bool build,cmMakefile *mf)

{
  string_view value;
  undefined8 uVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  char *__rhs;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  char local_102 [2];
  string local_100;
  string *local_e0;
  string *e;
  allocator<char> local_c9;
  string local_c8;
  cmValue local_a8;
  cmValue prevTool;
  undefined1 local_80 [8];
  string gbuild;
  undefined1 local_50 [8];
  string tsp;
  cmMakefile *mf_local;
  bool build_local;
  string *ts_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  if (build) {
    return true;
  }
  tsp.field_2._8_8_ = mf;
  std::__cxx11::string::string((string *)local_50);
  GetToolset(this,(cmMakefile *)tsp.field_2._8_8_,(string *)local_50,ts);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) != 0) {
    this_local._7_1_ = false;
    gbuild.field_2._8_4_ = 1;
    goto LAB_008659f6;
  }
  pcVar4 = (char *)std::__cxx11::string::back();
  __rhs = "/";
  if (*pcVar4 == '/') {
    __rhs = "";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prevTool,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,__rhs
                );
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&prevTool,
                 DEFAULT_BUILD_PROGRAM);
  std::__cxx11::string::~string((string *)&prevTool);
  uVar1 = tsp.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_MAKE_PROGRAM",&local_c9);
  local_a8 = cmMakefile::GetDefinition((cmMakefile *)uVar1,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  e = local_a8.Value;
  bVar2 = cmNonempty(local_a8);
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_a8);
    bVar2 = cmsys::SystemTools::ComparePath((string *)local_80,psVar5);
    if (bVar2) goto LAB_008657f1;
    local_102[1] = 10;
    psVar5 = cmValue::operator*[abi_cxx11_(&local_a8);
    local_102[0] = '\n';
    cmStrCat<char_const(&)[21],std::__cxx11::string&,char,char_const(&)[48],std::__cxx11::string_const&,char,char_const(&)[103]>
              (&local_100,(char (*) [21])"toolset build tool: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
               local_102 + 1,(char (*) [48])"Does not match the previously used build tool: ",psVar5
               ,local_102,
               (char (*) [103])
               "Either remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
              );
    local_e0 = &local_100;
    cmMakefile::IssueMessage((cmMakefile *)tsp.field_2._8_8_,FATAL_ERROR,local_e0);
    this_local._7_1_ = false;
    gbuild.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
LAB_008657f1:
    uVar1 = tsp.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_MAKE_PROGRAM",&local_129);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"build program to use",&local_151);
    cmMakefile::AddCacheDefinition
              ((cmMakefile *)uVar1,&local_128,(string *)local_80,&local_150,INTERNAL,true);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    uVar1 = tsp.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"CMAKE_SYSTEM_VERSION",&local_179);
    value = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    cmMakefile::AddDefinition((cmMakefile *)uVar1,&local_178,value);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
    this_local._7_1_ = true;
    gbuild.field_2._8_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_80);
LAB_008659f6:
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool cmGlobalGhsMultiGenerator::SetGeneratorToolset(std::string const& ts,
                                                    bool build, cmMakefile* mf)
{
  /* In build mode nothing to be done.
   * Toolset already determined and build tool absolute path is cached.
   */
  if (build) {
    return true;
  }

  /* Determine the absolute directory for the toolset */
  std::string tsp;
  this->GetToolset(mf, tsp, ts);

  /* no toolset was found */
  if (tsp.empty()) {
    return false;
  }

  /* set the build tool to use */
  std::string gbuild(tsp + ((tsp.back() == '/') ? "" : "/") +
                     DEFAULT_BUILD_PROGRAM);
  cmValue prevTool = mf->GetDefinition("CMAKE_MAKE_PROGRAM");

  /* check if the toolset changed from last generate */
  if (cmNonempty(prevTool) && !cmSystemTools::ComparePath(gbuild, *prevTool)) {
    std::string const& e = cmStrCat(
      "toolset build tool: ", gbuild, '\n',
      "Does not match the previously used build tool: ", *prevTool, '\n',
      "Either remove the CMakeCache.txt file and CMakeFiles "
      "directory or choose a different binary directory.");
    mf->IssueMessage(MessageType::FATAL_ERROR, e);
    return false;
  }

  /* store the toolset that is being used for this build */
  mf->AddCacheDefinition("CMAKE_MAKE_PROGRAM", gbuild, "build program to use",
                         cmStateEnums::INTERNAL, true);

  mf->AddDefinition("CMAKE_SYSTEM_VERSION", tsp);

  return true;
}